

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

bool __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::is_right_associative
          (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this)

{
  undefined8 uVar1;
  assertion_error *this_00;
  allocator<char> *in_RDI;
  string *in_stack_ffffffffffffff28;
  assertion_error *in_stack_ffffffffffffff30;
  int iVar2;
  undefined2 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  bool local_1;
  
  iVar2 = *(int *)in_RDI;
  if (iVar2 == 0xe) {
    if (*(long *)(in_RDI + 8) == 0) {
      uVar1 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT24(in_stack_ffffffffffffff6c,iVar2))),in_RDI);
      assertion_error::assertion_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __cxa_throw(uVar1,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    local_1 = jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ::is_right_associative
                        (*(jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                           **)(in_RDI + 8));
  }
  else if (iVar2 == 0x12) {
    if (*(long *)(in_RDI + 8) == 0) {
      uVar1 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT24(in_stack_ffffffffffffff6c,iVar2))),in_RDI);
      assertion_error::assertion_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __cxa_throw(uVar1,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    local_1 = unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::is_right_associative
                        (*(unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                           **)(in_RDI + 8));
  }
  else if (iVar2 == 0x13) {
    if (*(long *)(in_RDI + 8) == 0) {
      uVar3 = 1;
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffff6c,iVar2))),in_RDI)
      ;
      assertion_error::assertion_error(this_00,in_stack_ffffffffffffff28);
      __cxa_throw(this_00,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    local_1 = binary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::is_right_associative
                        (*(binary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                           **)(in_RDI + 8));
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_right_associative() const
        {
            switch(token_kind_)
            {
                case jsonpath_token_kind::selector:
                    JSONCONS_ASSERT(selector_ != nullptr);
                    return selector_->is_right_associative();
                case jsonpath_token_kind::unary_operator:
                    JSONCONS_ASSERT(unary_operator_ != nullptr);
                    return unary_operator_->is_right_associative();
                case jsonpath_token_kind::binary_operator:
                    JSONCONS_ASSERT(binary_operator_ != nullptr);
                    return binary_operator_->is_right_associative();
                default:
                    return false;
            }
        }